

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cpp
# Opt level: O0

void __thiscall Instruction::~Instruction(Instruction *this)

{
  Instruction *this_local;
  
  this->_vptr_Instruction = (_func_int **)&PTR__Instruction_0013bbd0;
  std::__cxx11::string::~string((string *)&this->m_text);
  return;
}

Assistant:

Instruction::~Instruction() {
}